

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Gluco::OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::
clean(OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted> *this,
     Lit *idx)

{
  bool bVar1;
  int iVar2;
  vec<Gluco::Solver::Watcher> *this_00;
  Watcher *pWVar3;
  Watcher *pWVar4;
  char *pcVar5;
  int local_2c;
  int local_28;
  int j;
  int i;
  vec<Gluco::Solver::Watcher> *vec;
  Lit *idx_local;
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>
  *this_local;
  
  iVar2 = toInt((Lit)idx->x);
  this_00 = vec<Gluco::vec<Gluco::Solver::Watcher>_>::operator[](&this->occs,iVar2);
  local_2c = 0;
  local_28 = 0;
  while( true ) {
    iVar2 = vec<Gluco::Solver::Watcher>::size(this_00);
    if (iVar2 <= local_28) break;
    pWVar3 = vec<Gluco::Solver::Watcher>::operator[](this_00,local_28);
    bVar1 = Solver::WatcherDeleted::operator()(&this->deleted,pWVar3);
    if (!bVar1) {
      pWVar3 = vec<Gluco::Solver::Watcher>::operator[](this_00,local_28);
      pWVar4 = vec<Gluco::Solver::Watcher>::operator[](this_00,local_2c);
      *pWVar4 = *pWVar3;
      local_2c = local_2c + 1;
    }
    local_28 = local_28 + 1;
  }
  vec<Gluco::Solver::Watcher>::shrink(this_00,local_28 - local_2c);
  iVar2 = toInt((Lit)idx->x);
  pcVar5 = vec<char>::operator[](&this->dirty,iVar2);
  *pcVar5 = '\0';
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::clean(const Idx& idx)
{
    Vec& vec = occs[toInt(idx)];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}